

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offscreen.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLint GVar6;
  GLFWwindow *handle;
  void *__ptr;
  int height;
  int width;
  GLuint vertex_buffer;
  float local_88;
  float local_78 [13];
  undefined8 local_44;
  undefined4 local_3c;
  
  glfwSetErrorCallback(error_callback);
  glfwInitHint(0x51002,0);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    glfwWindowHint(0x22002,2);
    glfwWindowHint(0x22003,0);
    glfwWindowHint(0x20004,0);
    handle = glfwCreateWindow(0x280,0x1e0,"Simple example",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      gladLoadGLLoader(glfwGetProcAddress);
      (*glad_glGenBuffers)(1,&vertex_buffer);
      (*glad_glBindBuffer)(0x8892,vertex_buffer);
      (*glad_glBufferData)(0x8892,0x3c,vertices,0x88e4);
      GVar3 = (*glad_glCreateShader)(0x8b31);
      (*glad_glShaderSource)(GVar3,1,&vertex_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar3);
      GVar4 = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(GVar4,1,&fragment_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar4);
      GVar5 = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(GVar5,GVar3);
      (*glad_glAttachShader)(GVar5,GVar4);
      (*glad_glLinkProgram)(GVar5);
      GVar6 = (*glad_glGetUniformLocation)(GVar5,"MVP");
      GVar3 = (*glad_glGetAttribLocation)(GVar5,"vPos");
      GVar4 = (*glad_glGetAttribLocation)(GVar5,"vCol");
      (*glad_glEnableVertexAttribArray)(GVar3);
      (*glad_glVertexAttribPointer)(GVar3,2,0x1406,'\0',0x14,(void *)0x0);
      (*glad_glEnableVertexAttribArray)(GVar4);
      (*glad_glVertexAttribPointer)(GVar4,3,0x1406,'\0',0x14,(void *)0x8);
      glfwGetFramebufferSize(handle,&width,&height);
      local_88 = (float)width / (float)height;
      (*glad_glViewport)(0,0,width,height);
      (*glad_glClear)(0x4000);
      local_78[0] = 2.0 / (local_88 + local_88);
      local_78[1] = 0.0;
      local_78[2] = 0.0;
      local_78[3] = 0.0;
      local_78[4] = 0.0;
      local_78[0xb] = 0.0;
      local_78[9] = 0.0;
      local_78[10] = 1.0;
      local_78[5] = 1.0;
      local_78[6] = 0.0;
      local_78[7] = 0.0;
      local_78[8] = 0.0;
      local_78[0xc] = -(local_88 - local_88) / (local_88 + local_88);
      local_44 = 0x80000000;
      local_3c = 0x3f800000;
      (*glad_glUseProgram)(GVar5);
      (*glad_glUniformMatrix4fv)(GVar6,1,'\0',local_78);
      (*glad_glDrawArrays)(4,0,3);
      iVar1 = width;
      iVar2 = height;
      __ptr = calloc(4,(long)(height * width));
      (*glad_glReadPixels)(0,0,iVar1,iVar2,0x1908,0x1401,__ptr);
      stbi_write_png("offscreen.png",width,height,4,
                     (void *)((long)((height + -1) * width * 4) + (long)__ptr),width * -4);
      free(__ptr);
      glfwDestroyWindow(handle);
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    GLFWwindow* window;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location, vcol_location;
    float ratio;
    int width, height;
    mat4x4 mvp;
    char* buffer;

    glfwSetErrorCallback(error_callback);

    glfwInitHint(GLFW_COCOA_MENUBAR, GLFW_FALSE);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);
    glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

    window = glfwCreateWindow(640, 480, "Simple example", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);

    // NOTE: OpenGL error checks have been omitted for brevity

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");
    vcol_location = glGetAttribLocation(program, "vCol");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);
    glEnableVertexAttribArray(vcol_location);
    glVertexAttribPointer(vcol_location, 3, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) (sizeof(float) * 2));

    glfwGetFramebufferSize(window, &width, &height);
    ratio = width / (float) height;

    glViewport(0, 0, width, height);
    glClear(GL_COLOR_BUFFER_BIT);

    mat4x4_ortho(mvp, -ratio, ratio, -1.f, 1.f, 1.f, -1.f);

    glUseProgram(program);
    glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
    glDrawArrays(GL_TRIANGLES, 0, 3);

#if USE_NATIVE_OSMESA
    glfwGetOSMesaColorBuffer(window, &width, &height, NULL, (void**) &buffer);
#else
    buffer = calloc(4, width * height);
    glReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, buffer);
#endif

    // Write image Y-flipped because OpenGL
    stbi_write_png("offscreen.png",
                   width, height, 4,
                   buffer + (width * 4 * (height - 1)),
                   -width * 4);

#if USE_NATIVE_OSMESA
    // Here is where there's nothing
#else
    free(buffer);
#endif

    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}